

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O1

Acb_Ntk_t *
Acb_NtkFromNdr(char *pFileName,void *pModule,Abc_Nam_t *pNames,Vec_Int_t *vWeights,int nNameIdMax)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Abc_Nam_t *pAVar7;
  Acb_Man_t *p;
  Acb_Ntk_t *p_00;
  void *__s;
  int *piVar8;
  long lVar9;
  char *pcVar10;
  Abc_Nam_t *pAVar11;
  Abc_Nam_t *pStrs;
  ulong uVar12;
  int iVar13;
  Acb_ObjType_t Type;
  int *piVar14;
  int iVar15;
  int iVar16;
  undefined4 in_register_00000084;
  Abc_Nam_t *pMods;
  ulong uVar17;
  long lVar18;
  int Ent_3;
  int iVar19;
  Hash_IntMan_t *in_R9;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  bool bVar25;
  int local_34;
  
  pMods = (Abc_Nam_t *)CONCAT44(in_register_00000084,nNameIdMax);
  pAVar11 = (Abc_Nam_t *)vWeights;
  pAVar7 = Abc_NamRef(pNames);
  p = Acb_ManAlloc(pFileName,(int)pAVar7,pStrs,pAVar11,pMods,in_R9);
  iVar24 = 0;
  iVar4 = Abc_NamStrFindOrAdd(p->pStrs,p->pName,(int *)0x0);
  lVar9 = *(long *)((long)pModule + 0x10);
  iVar13 = *(int *)(lVar9 + 8) + 2;
  iVar15 = 0;
  if (3 < iVar13) {
    iVar16 = 3;
    iVar15 = 0;
    do {
      lVar20 = (long)iVar16;
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar20);
      if (bVar1 == 3) {
        for (iVar19 = iVar16 + 1; uVar6 = 1, iVar19 < *(int *)(lVar9 + lVar20 * 4) + iVar16;
            iVar19 = iVar19 + iVar21) {
          lVar22 = (long)iVar19;
          bVar2 = *(byte *)(*(long *)((long)pModule + 8) + lVar22);
          if (bVar2 == 6) {
            uVar6 = (uint)(*(int *)(lVar9 + lVar22 * 4) == 3);
            break;
          }
          if (bVar2 == 0) goto LAB_0036a648;
          iVar21 = 1;
          if (bVar2 < 4) {
            iVar21 = *(int *)(lVar9 + lVar22 * 4);
          }
        }
        iVar15 = iVar15 + uVar6;
      }
      else if (bVar1 == 0) goto LAB_0036a648;
      iVar19 = 1;
      if (bVar1 < 4) {
        iVar19 = *(int *)(lVar9 + lVar20 * 4);
      }
      iVar16 = iVar16 + iVar19;
    } while (iVar16 < iVar13);
  }
  if (3 < iVar13) {
    iVar16 = 3;
    iVar24 = 0;
    do {
      lVar20 = (long)iVar16;
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar20);
      if (bVar1 == 3) {
        for (iVar19 = iVar16 + 1; uVar6 = 1, iVar19 < *(int *)(lVar9 + lVar20 * 4) + iVar16;
            iVar19 = iVar19 + iVar21) {
          lVar22 = (long)iVar19;
          bVar2 = *(byte *)(*(long *)((long)pModule + 8) + lVar22);
          if (bVar2 == 6) {
            uVar6 = (uint)(*(int *)(lVar9 + lVar22 * 4) == 4);
            break;
          }
          if (bVar2 == 0) goto LAB_0036a648;
          iVar21 = 1;
          if (bVar2 < 4) {
            iVar21 = *(int *)(lVar9 + lVar22 * 4);
          }
        }
        iVar24 = iVar24 + uVar6;
      }
      else if (bVar1 == 0) goto LAB_0036a648;
      iVar19 = 1;
      if (bVar1 < 4) {
        iVar19 = *(int *)(lVar9 + lVar20 * 4);
      }
      iVar16 = iVar16 + iVar19;
    } while (iVar16 < iVar13);
  }
  iVar16 = 0;
  if (3 < iVar13) {
    iVar19 = 3;
    iVar16 = 0;
    do {
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + (long)iVar19);
      if (bVar1 == 0) goto LAB_0036a648;
      iVar21 = 1;
      if (bVar1 < 4) {
        iVar21 = *(int *)(lVar9 + (long)iVar19 * 4);
      }
      iVar16 = iVar16 + (uint)(bVar1 == 3);
      iVar19 = iVar19 + iVar21;
    } while (iVar19 < iVar13);
  }
  p_00 = Acb_NtkAlloc(p,iVar4,iVar15,iVar24,iVar16);
  iVar24 = 0x10;
  if (0xe < nNameIdMax - 1U) {
    iVar24 = nNameIdMax;
  }
  if (iVar24 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar24 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)nNameIdMax << 2);
  }
  uVar6 = (p_00->vObjType).nCap;
  if ((p_00->vObjWeight).nCap < (int)uVar6) {
    piVar8 = (p_00->vObjWeight).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar6 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar6 << 2);
    }
    (p_00->vObjWeight).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0036a7c5;
    (p_00->vObjWeight).nCap = uVar6;
  }
  if (0 < (int)uVar6) {
    memset((p_00->vObjWeight).pArray,0,(ulong)uVar6 * 4);
  }
  (p_00->vObjWeight).nSize = uVar6;
  uVar6 = (p_00->vObjType).nCap;
  if ((p_00->vObjName).nCap < (int)uVar6) {
    piVar8 = (p_00->vObjName).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar6 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar6 << 2);
    }
    (p_00->vObjName).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
LAB_0036a7c5:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vObjName).nCap = uVar6;
  }
  if (0 < (int)uVar6) {
    memset((p_00->vObjName).pArray,0,(ulong)uVar6 * 4);
  }
  (p_00->vObjName).nSize = uVar6;
  lVar9 = *(long *)((long)pModule + 0x10);
  if (3 < *(int *)(lVar9 + 8) + 2) {
    iVar24 = 3;
    do {
      lVar20 = *(long *)((long)pModule + 8);
      lVar22 = (long)iVar24;
      if (*(char *)(lVar20 + lVar22) == '\x03') {
        iVar15 = iVar24 + 1;
        iVar13 = *(int *)(lVar9 + lVar22 * 4) + iVar24;
        uVar12 = 0xffffffff;
        iVar4 = iVar15;
        if (iVar15 < iVar13) {
          do {
            lVar18 = (long)iVar4;
            bVar1 = *(byte *)(lVar20 + lVar18);
            if (bVar1 == 6) {
              if (*(int *)(lVar9 + lVar18 * 4) != 3) goto LAB_00369db1;
              break;
            }
            if (bVar1 == 0) goto LAB_0036a648;
            iVar16 = 1;
            if (bVar1 < 4) {
              iVar16 = *(int *)(lVar9 + lVar18 * 4);
            }
            iVar4 = iVar4 + iVar16;
          } while (iVar4 < iVar13);
          do {
            if (iVar13 <= iVar15) break;
            lVar18 = (long)iVar15;
            bVar1 = *(byte *)(lVar20 + lVar18);
            if (bVar1 == 5) {
              uVar12 = (ulong)*(uint *)(lVar9 + lVar18 * 4);
              break;
            }
            if (bVar1 == 0) goto LAB_0036a648;
            iVar4 = 1;
            if (bVar1 < 4) {
              iVar4 = *(int *)(lVar9 + lVar18 * 4);
            }
            iVar15 = iVar15 + iVar4;
          } while( true );
        }
        uVar6 = Acb_ObjAlloc(p_00,ABC_OPER_CI,0,(int)lVar20);
        iVar4 = (int)uVar12;
        if ((iVar4 < 0) || (nNameIdMax <= iVar4)) goto LAB_0036a6cd;
        *(uint *)((long)__s + uVar12 * 4) = uVar6;
        if ((int)uVar6 < 1) goto LAB_0036a6ec;
        iVar15 = (p_00->vObjName).nSize;
        if (iVar15 < 1) goto LAB_0036a6a5;
        if (iVar15 <= (int)uVar6) goto LAB_0036a667;
        piVar8 = (p_00->vObjName).pArray;
        if (piVar8[uVar6] != 0) goto LAB_0036a6ae;
        piVar8[uVar6] = iVar4;
        if (vWeights == (Vec_Int_t *)0x0) {
          iVar4 = 1;
        }
        else {
          if (vWeights->nSize <= iVar4) goto LAB_0036a667;
          iVar4 = vWeights->pArray[uVar12];
        }
        iVar15 = (p_00->vObjWeight).nSize;
        if (iVar15 < 1) goto LAB_0036a787;
        if (iVar15 <= (int)uVar6) goto LAB_0036a667;
        piVar8 = (p_00->vObjWeight).pArray;
        if (piVar8[uVar6] != 0) goto LAB_0036a768;
        piVar8[uVar6] = iVar4;
      }
      else if (*(char *)(lVar20 + lVar22) == '\0') goto LAB_0036a648;
LAB_00369db1:
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar22);
      if (bVar1 == 0) goto LAB_0036a648;
      iVar4 = 1;
      if (bVar1 < 4) {
        iVar4 = *(int *)(*(long *)((long)pModule + 0x10) + lVar22 * 4);
      }
      iVar24 = iVar24 + iVar4;
      lVar9 = *(long *)((long)pModule + 0x10);
    } while (iVar24 < *(int *)(lVar9 + 8) + 2);
  }
  lVar9 = *(long *)((long)pModule + 0x10);
  if (3 < *(int *)(lVar9 + 8) + 2) {
    iVar24 = 3;
    do {
      lVar20 = (long)iVar24;
      cVar3 = *(char *)(*(long *)((long)pModule + 8) + lVar20);
      if (cVar3 == '\n') {
        iVar4 = *(int *)(lVar9 + lVar20 * 4);
        uVar6 = Acb_ObjAlloc(p_00,ABC_OPER_CONST_F,0,10);
        if (((long)iVar4 < 0) || (nNameIdMax <= iVar4)) goto LAB_0036a6cd;
        *(uint *)((long)__s + (long)iVar4 * 4) = uVar6;
        if ((int)uVar6 < 1) goto LAB_0036a6ec;
        iVar15 = (p_00->vObjName).nSize;
        if (iVar15 < 1) goto LAB_0036a6a5;
        if (iVar15 <= (int)uVar6) goto LAB_0036a667;
        piVar8 = (p_00->vObjName).pArray;
        if (piVar8[uVar6] != 0) goto LAB_0036a6ae;
        piVar8[uVar6] = iVar4;
        Vec_IntPush(&p_00->vTargets,uVar6);
      }
      else if (cVar3 == '\0') goto LAB_0036a648;
      bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar20);
      if (bVar1 == 0) goto LAB_0036a648;
      iVar4 = 1;
      if (bVar1 < 4) {
        iVar4 = *(int *)(*(long *)((long)pModule + 0x10) + lVar20 * 4);
      }
      iVar24 = iVar24 + iVar4;
      lVar9 = *(long *)((long)pModule + 0x10);
    } while (iVar24 < *(int *)(lVar9 + 8) + 2);
  }
  lVar9 = *(long *)((long)pModule + 0x10);
  if (3 < *(int *)(lVar9 + 8) + 2) {
    iVar24 = 3;
LAB_00369eed:
    lVar20 = *(long *)((long)pModule + 8);
    lVar22 = (long)iVar24;
    if (*(char *)(lVar20 + lVar22) != '\x03') {
      if (*(char *)(lVar20 + lVar22) != '\0') goto LAB_0036a0dd;
      goto LAB_0036a648;
    }
    iVar13 = *(int *)(lVar9 + lVar22 * 4) + iVar24;
    iVar15 = iVar24 + 1;
    for (iVar4 = iVar15; iVar4 < iVar13; iVar4 = iVar4 + iVar16) {
      lVar18 = (long)iVar4;
      bVar1 = *(byte *)(lVar20 + lVar18);
      if (bVar1 == 6) {
        if ((iVar15 < iVar13) && (iVar4 = iVar15, *(int *)(lVar9 + lVar18 * 4) != 3))
        goto LAB_00369f6a;
        break;
      }
      if (bVar1 == 0) goto LAB_0036a648;
      iVar16 = 1;
      if (bVar1 < 4) {
        iVar16 = *(int *)(lVar9 + lVar18 * 4);
      }
    }
    goto LAB_0036a0dd;
  }
LAB_0036a115:
  if (*(int *)(lVar9 + 8) + 2 < 4) {
LAB_0036a3d5:
    lVar9 = *(long *)((long)pModule + 0x10);
    if (3 < *(int *)(lVar9 + 8) + 2) {
      iVar24 = 3;
      do {
        lVar20 = *(long *)((long)pModule + 8);
        lVar22 = (long)iVar24;
        if (*(char *)(lVar20 + lVar22) == '\x03') {
          iVar4 = iVar24 + 1;
          iVar13 = *(int *)(lVar9 + lVar22 * 4) + iVar24;
          iVar15 = iVar4;
          if (iVar4 < iVar13) {
            do {
              lVar18 = (long)iVar15;
              bVar1 = *(byte *)(lVar20 + lVar18);
              if (bVar1 == 6) {
                if (*(int *)(lVar9 + lVar18 * 4) != 4) goto LAB_0036a584;
                break;
              }
              if (bVar1 == 0) goto LAB_0036a648;
              iVar16 = 1;
              if (bVar1 < 4) {
                iVar16 = *(int *)(lVar9 + lVar18 * 4);
              }
              iVar15 = iVar15 + iVar16;
            } while (iVar15 < iVar13);
            iVar15 = 0;
            bVar25 = false;
            piVar8 = (int *)0x0;
            if (iVar4 < iVar13) {
              do {
                lVar18 = (long)iVar4;
                bVar1 = *(byte *)(lVar20 + lVar18);
                if (bVar1 == 4) {
                  iVar15 = iVar15 + 1;
                  if (piVar8 == (int *)0x0) {
                    piVar8 = (int *)(lVar9 + lVar18 * 4);
                  }
                }
                else {
                  if (bVar1 == 0) goto LAB_0036a648;
                  if (piVar8 != (int *)0x0) break;
                }
                if (bVar1 == 0) goto LAB_0036a648;
                iVar16 = 1;
                if (bVar1 < 4) {
                  iVar16 = *(int *)(lVar9 + lVar18 * 4);
                }
                iVar4 = iVar4 + iVar16;
              } while (iVar4 < iVar13);
              bVar25 = iVar15 == 1;
            }
          }
          else {
            piVar8 = (int *)0x0;
            bVar25 = false;
          }
          if (!bVar25) {
            __assert_fail("nArray == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbAbc.c"
                          ,0xd5,
                          "Acb_Ntk_t *Acb_NtkFromNdr(char *, void *, Abc_Nam_t *, Vec_Int_t *, int)"
                         );
          }
          uVar6 = Acb_ObjAlloc(p_00,ABC_OPER_CO,1,(int)lVar20);
          iVar4 = *piVar8;
          if (((long)iVar4 < 0) || (nNameIdMax <= iVar4)) {
LAB_0036a667:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((int)uVar6 < 1) {
LAB_0036a72a:
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
          }
          if ((p_00->vObjFans).nSize <= (int)uVar6) goto LAB_0036a667;
          iVar15 = (p_00->vObjFans).pArray[uVar6];
          if (((long)iVar15 < 0) || ((p_00->vFanSto).nSize <= iVar15)) {
LAB_0036a686:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          iVar4 = *(int *)((long)__s + (long)iVar4 * 4);
          if (iVar4 < 1) {
LAB_0036a749:
            __assert_fail("iFanin > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
          }
          piVar14 = (p_00->vFanSto).pArray + iVar15;
          iVar15 = *piVar14;
          if (piVar14[(long)iVar15 + 1] != -1) {
LAB_0036a70b:
            __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
          }
          *piVar14 = iVar15 + 1;
          piVar14[(long)iVar15 + 1] = iVar4;
          iVar4 = (p_00->vObjName).nSize;
          if (iVar4 < 1) goto LAB_0036a6a5;
          if (iVar4 <= (int)uVar6) goto LAB_0036a667;
          piVar14 = (p_00->vObjName).pArray;
          if (piVar14[uVar6] != 0) {
LAB_0036a6ae:
            __assert_fail("Acb_ObjName(p, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0x11e,"void Acb_ObjSetName(Acb_Ntk_t *, int, int)");
          }
          piVar14[uVar6] = *piVar8;
        }
        else if (*(char *)(lVar20 + lVar22) == '\0') {
LAB_0036a648:
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
LAB_0036a584:
        bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar22);
        if (bVar1 == 0) goto LAB_0036a648;
        iVar4 = 1;
        if (bVar1 < 4) {
          iVar4 = *(int *)(*(long *)((long)pModule + 0x10) + lVar22 * 4);
        }
        iVar24 = iVar24 + iVar4;
        lVar9 = *(long *)((long)pModule + 0x10);
      } while (iVar24 < *(int *)(lVar9 + 8) + 2);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    p_00->nRegs = 0;
    pAVar11 = p->pMods;
    pcVar10 = Abc_NamStr(p_00->pDesign->pStrs,p_00->NameId);
    iVar24 = Abc_NamStrFindOrAdd(pAVar11,pcVar10,&local_34);
    if (local_34 == 0) {
      if (iVar24 != p_00->Id) {
        __assert_fail("NtkId == pNtk->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x2a0,"void Acb_NtkAdd(Acb_Man_t *, Acb_Ntk_t *)");
      }
    }
    else {
      pcVar10 = Abc_NamStr(p_00->pDesign->pStrs,p_00->NameId);
      printf("Network with name \"%s\" already exists.\n",pcVar10);
    }
    return p_00;
  }
  lVar20 = *(long *)((long)pModule + 8);
  iVar24 = 3;
LAB_0036a12d:
  lVar22 = (long)iVar24;
  if (*(char *)(lVar20 + lVar22) != '\x03') {
    if (*(char *)(lVar20 + lVar22) != '\0') goto LAB_0036a3aa;
    goto LAB_0036a648;
  }
  iVar13 = *(int *)(lVar9 + lVar22 * 4) + iVar24;
  iVar4 = iVar24 + 1;
  for (iVar15 = iVar4; iVar15 < iVar13; iVar15 = iVar15 + iVar16) {
    lVar18 = (long)iVar15;
    bVar1 = *(byte *)(lVar20 + lVar18);
    if (bVar1 == 6) {
      if ((iVar4 < iVar13) && (iVar15 = iVar4, *(int *)(lVar9 + lVar18 * 4) != 3))
      goto LAB_0036a1a6;
      break;
    }
    if (bVar1 == 0) goto LAB_0036a648;
    iVar16 = 1;
    if (bVar1 < 4) {
      iVar16 = *(int *)(lVar9 + lVar18 * 4);
    }
  }
  goto LAB_0036a3aa;
  while( true ) {
    if (bVar1 == 0) goto LAB_0036a648;
    iVar16 = 1;
    if (bVar1 < 4) {
      iVar16 = *(int *)(lVar9 + lVar18 * 4);
    }
    iVar4 = iVar4 + iVar16;
    if (iVar13 <= iVar4) break;
LAB_00369f6a:
    lVar18 = (long)iVar4;
    bVar1 = *(byte *)(lVar20 + lVar18);
    if (bVar1 == 6) {
      iVar4 = iVar15;
      if (*(int *)(lVar9 + lVar18 * 4) != 4) goto joined_r0x00369fab;
      break;
    }
  }
  goto LAB_0036a0dd;
joined_r0x00369fab:
  if (iVar13 <= iVar4) goto LAB_00369fde;
  lVar18 = (long)iVar4;
  bVar1 = *(byte *)(lVar20 + lVar18);
  if (bVar1 == 5) {
    uVar6 = *(uint *)(lVar9 + lVar18 * 4);
    goto LAB_00369fef;
  }
  if (bVar1 == 0) goto LAB_0036a648;
  iVar16 = 1;
  if (bVar1 < 4) {
    iVar16 = *(int *)(lVar9 + lVar18 * 4);
  }
  iVar4 = iVar4 + iVar16;
  goto joined_r0x00369fab;
LAB_00369fde:
  uVar6 = 0xffffffff;
LAB_00369fef:
  iVar4 = 0;
  if (iVar15 < iVar13) {
    lVar18 = 0;
    iVar4 = 0;
    iVar16 = iVar15;
    do {
      lVar23 = (long)iVar16;
      bVar1 = *(byte *)(lVar20 + lVar23);
      if (bVar1 == 4) {
        iVar4 = iVar4 + 1;
        if (lVar18 == 0) {
          lVar18 = lVar9 + lVar23 * 4;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_0036a648;
        if (lVar18 != 0) break;
      }
      if (bVar1 == 0) goto LAB_0036a648;
      iVar19 = 1;
      if (bVar1 < 4) {
        iVar19 = *(int *)(lVar9 + lVar23 * 4);
      }
      iVar16 = iVar16 + iVar19;
    } while (iVar16 < iVar13);
  }
  Type = ~ABC_OPER_NONE;
  for (; iVar15 < iVar13; iVar15 = iVar15 + iVar16) {
    lVar18 = (long)iVar15;
    bVar1 = *(byte *)(lVar20 + lVar18);
    if (bVar1 == 6) {
      Type = *(Acb_ObjType_t *)(lVar9 + lVar18 * 4);
      break;
    }
    if (bVar1 == 0) goto LAB_0036a648;
    iVar16 = 1;
    if (bVar1 < 4) {
      iVar16 = *(int *)(lVar9 + lVar18 * 4);
    }
  }
  uVar5 = Acb_ObjAlloc(p_00,Type,iVar4,(int)lVar20);
  if (((int)uVar6 < 0) || (nNameIdMax <= (int)uVar6)) {
LAB_0036a6cd:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(uint *)((long)__s + (ulong)uVar6 * 4) = uVar5;
  if ((int)uVar5 < 1) goto LAB_0036a6ec;
  iVar4 = (p_00->vObjName).nSize;
  if (iVar4 < 1) goto LAB_0036a6a5;
  if (iVar4 <= (int)uVar5) goto LAB_0036a667;
  piVar8 = (p_00->vObjName).pArray;
  if (piVar8[uVar5] != 0) goto LAB_0036a6ae;
  piVar8[uVar5] = uVar6;
LAB_0036a0dd:
  bVar1 = *(byte *)(*(long *)((long)pModule + 8) + lVar22);
  if (bVar1 == 0) goto LAB_0036a648;
  iVar4 = 1;
  if (bVar1 < 4) {
    iVar4 = *(int *)(*(long *)((long)pModule + 0x10) + lVar22 * 4);
  }
  iVar24 = iVar24 + iVar4;
  lVar9 = *(long *)((long)pModule + 0x10);
  if (*(int *)(lVar9 + 8) + 2 <= iVar24) goto LAB_0036a115;
  goto LAB_00369eed;
LAB_0036a6ec:
  pcVar10 = "i>0";
  goto LAB_0036a6f3;
  while( true ) {
    if (bVar1 == 0) goto LAB_0036a648;
    iVar16 = 1;
    if (bVar1 < 4) {
      iVar16 = *(int *)(lVar9 + lVar18 * 4);
    }
    iVar15 = iVar15 + iVar16;
    if (iVar13 <= iVar15) break;
LAB_0036a1a6:
    lVar18 = (long)iVar15;
    bVar1 = *(byte *)(lVar20 + lVar18);
    if (bVar1 == 6) {
      if (*(int *)(lVar9 + lVar18 * 4) != 4) {
        uVar6 = 0xffffffff;
        iVar15 = iVar4;
        goto joined_r0x0036a1ed;
      }
      break;
    }
  }
  goto LAB_0036a3aa;
joined_r0x0036a1ed:
  if (iVar13 <= iVar15) goto LAB_0036a228;
  lVar18 = (long)iVar15;
  bVar1 = *(byte *)(lVar20 + lVar18);
  if (bVar1 == 5) {
    uVar6 = *(uint *)(lVar9 + lVar18 * 4);
    goto LAB_0036a228;
  }
  if (bVar1 == 0) goto LAB_0036a648;
  iVar16 = 1;
  if (bVar1 < 4) {
    iVar16 = *(int *)(lVar9 + lVar18 * 4);
  }
  iVar15 = iVar15 + iVar16;
  goto joined_r0x0036a1ed;
LAB_0036a228:
  if (((int)uVar6 < 0) || (nNameIdMax <= (int)uVar6)) goto LAB_0036a667;
  uVar5 = *(uint *)((long)__s + (ulong)uVar6 * 4);
  lVar18 = 0;
  uVar12 = 0;
  for (; iVar4 < iVar13; iVar4 = iVar4 + iVar15) {
    lVar23 = (long)iVar4;
    bVar1 = *(byte *)(lVar20 + lVar23);
    if (bVar1 == 4) {
      uVar12 = (ulong)((int)uVar12 + 1);
      if (lVar18 == 0) {
        lVar18 = lVar9 + lVar23 * 4;
      }
    }
    else {
      if (bVar1 == 0) goto LAB_0036a648;
      if (lVar18 != 0) break;
    }
    if (bVar1 == 0) goto LAB_0036a648;
    iVar15 = 1;
    if (bVar1 < 4) {
      iVar15 = *(int *)(lVar9 + lVar23 * 4);
    }
  }
  if (0 < (int)uVar12) {
    uVar17 = 0;
    do {
      iVar4 = *(int *)(lVar18 + uVar17 * 4);
      if (((long)iVar4 < 0) || (nNameIdMax <= iVar4)) goto LAB_0036a667;
      if ((int)uVar5 < 1) goto LAB_0036a72a;
      if ((p_00->vObjFans).nSize <= (int)uVar5) goto LAB_0036a667;
      iVar15 = (p_00->vObjFans).pArray[uVar5];
      if (((long)iVar15 < 0) || ((p_00->vFanSto).nSize <= iVar15)) goto LAB_0036a686;
      iVar4 = *(int *)((long)__s + (long)iVar4 * 4);
      if (iVar4 < 1) goto LAB_0036a749;
      piVar8 = (p_00->vFanSto).pArray + iVar15;
      iVar15 = *piVar8;
      if (piVar8[(long)iVar15 + 1] != -1) goto LAB_0036a70b;
      *piVar8 = iVar15 + 1;
      piVar8[(long)iVar15 + 1] = iVar4;
      uVar17 = uVar17 + 1;
    } while (uVar12 != uVar17);
  }
  if (vWeights == (Vec_Int_t *)0x0) {
    iVar4 = 1;
  }
  else {
    if (vWeights->nSize <= (int)uVar6) goto LAB_0036a667;
    iVar4 = vWeights->pArray[uVar6];
  }
  if ((int)uVar5 < 1) {
    pcVar10 = "i>0";
    goto LAB_0036a78e;
  }
  iVar15 = (p_00->vObjWeight).nSize;
  if (iVar15 < 1) goto LAB_0036a787;
  if (iVar15 <= (int)uVar5) goto LAB_0036a667;
  piVar8 = (p_00->vObjWeight).pArray;
  if (piVar8[uVar5] != 0) {
LAB_0036a768:
    __assert_fail("Acb_ObjWeight(p, i)== 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x11c,"void Acb_ObjSetWeight(Acb_Ntk_t *, int, int)");
  }
  piVar8[uVar5] = iVar4;
LAB_0036a3aa:
  if (*(byte *)(lVar20 + lVar22) == 0) goto LAB_0036a648;
  iVar4 = 1;
  if (*(byte *)(lVar20 + lVar22) < 4) {
    iVar4 = *(int *)(lVar9 + lVar22 * 4);
  }
  iVar24 = iVar24 + iVar4;
  if (*(int *)(lVar9 + 8) + 2 <= iVar24) goto LAB_0036a3d5;
  goto LAB_0036a12d;
LAB_0036a787:
  pcVar10 = "Acb_NtkHasObjWeights(p)";
LAB_0036a78e:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
LAB_0036a6a5:
  pcVar10 = "Acb_NtkHasObjNames(p)";
LAB_0036a6f3:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
}

Assistant:

Acb_Ntk_t * Acb_NtkFromNdr( char * pFileName, void * pModule, Abc_Nam_t * pNames, Vec_Int_t * vWeights, int nNameIdMax )
{
    Ndr_Data_t * p   = (Ndr_Data_t *)pModule; 
    Acb_Man_t * pMan = Acb_ManAlloc( pFileName, 1, Abc_NamRef(pNames), NULL, NULL, NULL );
    int k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, pMan->pName, NULL );
    int Mod = 2, Obj, Type, nArray, * pArray, ObjId;
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Ndr_DataCiNum(p, Mod), Ndr_DataCoNum(p, Mod), Ndr_DataObjNum(p, Mod) );
    Vec_Int_t * vMap = Vec_IntStart( nNameIdMax );
    Acb_NtkCleanObjWeights( pNtk );
    Acb_NtkCleanObjNames( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachTarget( p, Mod, Obj )
    {
        NameId = Ndr_DataEntry( p, Obj );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CONST_F, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Vec_IntPush( &pNtk->vTargets, ObjId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Type   = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        ObjId  = Acb_ObjAlloc( pNtk, (Acb_ObjType_t) Type, nArray, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        //char * pName;
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        //pName = Abc_NamStr( pMan->pStrs, NameId );
        ObjId  = Vec_IntEntry( vMap, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( k = 0; k < nArray; k++ )
            Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[k]) );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        assert( nArray == 1 );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[0]) );
        Acb_ObjSetName( pNtk, ObjId, pArray[0] );
    }
    Vec_IntFree( vMap );
    Acb_NtkSetRegNum( pNtk, 0 );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}